

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.cpp
# Opt level: O0

bool __thiscall DisplayText::Decode(DisplayText *this,uchar *pIn,size_t cbIn,size_t *cbUsed)

{
  size_t *cbUsed_local;
  size_t cbIn_local;
  uchar *pIn_local;
  DisplayText *this_local;
  
  if (cbIn < 2) {
    this_local._7_1_ = false;
  }
  else {
    switch(*pIn) {
    case '\x05':
      this->type = NotSet;
      break;
    default:
      return false;
    case '\f':
      this->type = UTF8;
      break;
    case '\x1a':
      this->type = Visible;
      break;
    case '\x1e':
      this->type = BMP;
    }
    this_local._7_1_ = AnyType::Decode(&this->value,pIn,cbIn,cbUsed);
  }
  return this_local._7_1_;
}

Assistant:

bool DisplayText::Decode(const unsigned char * pIn, size_t cbIn, size_t & cbUsed)
{
    if (cbIn < 2)
        return false;

    switch (static_cast<DerType>(pIn[0]))
    {
    case DerType::VisibleString:
        type = DisplayTextType::Visible;
        break;
    case DerType::UTF8String:
        type = DisplayTextType::UTF8;
        break;
    case DerType::BMPString:
        type = DisplayTextType::BMP;
        break;
    case DerType::Null:
        type = DisplayTextType::NotSet;
        break;
    default:
        return false;
    }

    return value.Decode(pIn, cbIn, cbUsed);
}